

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Method * __thiscall
capnp::InterfaceSchema::getMethodByName
          (Method *__return_storage_ptr__,InterfaceSchema *this,StringPtr name)

{
  NullableValue<capnp::InterfaceSchema::Method> *other;
  Method *pMVar1;
  Fault local_e0;
  Fault f;
  Maybe<capnp::InterfaceSchema::Method> local_b0;
  undefined1 local_68 [8];
  NullableValue<capnp::InterfaceSchema::Method> method;
  InterfaceSchema *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (InterfaceSchema *)name.content.ptr;
  method.field_1._56_8_ = this;
  findMethodByName(&local_b0,this,name);
  other = kj::_::readMaybe<capnp::InterfaceSchema::Method>(&local_b0);
  kj::_::NullableValue<capnp::InterfaceSchema::Method>::NullableValue
            ((NullableValue<capnp::InterfaceSchema::Method> *)local_68,other);
  kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_b0);
  pMVar1 = kj::_::NullableValue::operator_cast_to_Method_((NullableValue *)local_68);
  if (pMVar1 != (Method *)0x0) {
    pMVar1 = kj::_::NullableValue<capnp::InterfaceSchema::Method>::operator*
                       ((NullableValue<capnp::InterfaceSchema::Method> *)local_68);
    memcpy(__return_storage_ptr__,pMVar1,0x40);
    kj::_::NullableValue<capnp::InterfaceSchema::Method>::~NullableValue
              ((NullableValue<capnp::InterfaceSchema::Method> *)local_68);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29],kj::StringPtr&>
            (&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
             ,0x254,FAILED,(char *)0x0,"\"interface has no such method\", name",
             (char (*) [29])"interface has no such method",(StringPtr *)&this_local);
  kj::_::Debug::Fault::fatal(&local_e0);
}

Assistant:

InterfaceSchema::Method InterfaceSchema::getMethodByName(kj::StringPtr name) const {
  KJ_IF_MAYBE(method, findMethodByName(name)) {
    return *method;
  } else {
    KJ_FAIL_REQUIRE("interface has no such method", name);
  }
}